

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_path * mg_path_make(uint32_t node_count,mg_node **nodes,uint32_t relationship_count,
                      mg_unbound_relationship **relationships,uint32_t sequence_length,
                      int64_t *sequence)

{
  mg_allocator *in_RCX;
  uint32_t in_EDX;
  void *in_RSI;
  uint in_EDI;
  uint in_R8D;
  void *in_R9;
  mg_path *path;
  mg_path *local_8;
  
  local_8 = mg_path_alloc((uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,in_EDX,in_RCX);
  if (local_8 == (mg_path *)0x0) {
    local_8 = (mg_path *)0x0;
  }
  else {
    local_8->node_count = in_EDI;
    memcpy(local_8->nodes,in_RSI,(ulong)in_EDI << 3);
    local_8->relationship_count = in_EDX;
    memcpy(local_8->relationships,in_RCX,(ulong)in_EDX << 3);
    local_8->sequence_length = in_R8D;
    memcpy(local_8->sequence,in_R9,(ulong)in_R8D << 3);
  }
  return local_8;
}

Assistant:

mg_path *mg_path_make(uint32_t node_count, mg_node **nodes,
                      uint32_t relationship_count,
                      mg_unbound_relationship **relationships,
                      uint32_t sequence_length, const int64_t *const sequence) {
  mg_path *path = mg_path_alloc(node_count, relationship_count, sequence_length,
                                &mg_system_allocator);
  if (!path) {
    return NULL;
  }
  path->node_count = node_count;
  memcpy(path->nodes, nodes, node_count * sizeof(mg_node *));
  path->relationship_count = relationship_count;
  memcpy(path->relationships, relationships,
         relationship_count * sizeof(mg_unbound_relationship *));
  path->sequence_length = sequence_length;
  memcpy(path->sequence, sequence, sequence_length * sizeof(int64_t));
  return path;
}